

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O3

shared_ptr<spdlog::logger> __thiscall
bidfx_public_api::tools::LoggerFactory::GetLogger(LoggerFactory *this,string *log_id)

{
  pair<std::_Rb_tree_iterator<std::shared_ptr<spdlog::logger>_>,_bool> pVar1;
  shared_ptr<spdlog::logger> sVar2;
  undefined1 local_21;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_18;
  
  local_18._M_current = sinks_;
  local_20._M_current = DAT_001ecc28;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::logger,std::allocator<spdlog::logger>,std::__cxx11::string&,__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(logger **)this,
             (allocator<spdlog::logger> *)&local_21,log_id,&local_18,&local_20);
  if (DAT_001ebd48 == '\x01') {
    LOCK();
    *(undefined4 *)(*(long *)this + 0x44) = flush_severity_;
    UNLOCK();
  }
  LOCK();
  *(undefined4 *)(*(long *)this + 0x40) = level_;
  UNLOCK();
  pVar1 = std::
          _Rb_tree<std::shared_ptr<spdlog::logger>,std::shared_ptr<spdlog::logger>,std::_Identity<std::shared_ptr<spdlog::logger>>,std::less<std::shared_ptr<spdlog::logger>>,std::allocator<std::shared_ptr<spdlog::logger>>>
          ::_M_insert_unique<std::shared_ptr<spdlog::logger>const&>
                    ((_Rb_tree<std::shared_ptr<spdlog::logger>,std::shared_ptr<spdlog::logger>,std::_Identity<std::shared_ptr<spdlog::logger>>,std::less<std::shared_ptr<spdlog::logger>>,std::allocator<std::shared_ptr<spdlog::logger>>>
                      *)loggers_,(shared_ptr<spdlog::logger> *)this);
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       pVar1._8_8_;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<spdlog::logger> LoggerFactory::GetLogger(std::string log_id)
{
    auto logger = std::make_shared<spdlog::logger>(log_id, begin(sinks_), end(sinks_));
    if (flush_severity_)
    {
        logger->flush_on(*flush_severity_);
    }
    logger->set_level(level_);
    loggers_.insert(logger);
    return logger;
}